

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O0

void envy_bios_parse_d_dp_info(envy_bios *bios)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  envy_bios_d_dp_info *peVar12;
  envy_bios_d_dp_info_entry *peVar13;
  envy_bios_d_dp_info_before_link_speed *peVar14;
  envy_bios_d_dp_info_level_entry_table *peVar15;
  envy_bios_d_dp_info_level_entry *peVar16;
  envy_bios_d_dp_info_level_entry *le;
  envy_bios_d_dp_info_level_entry_table *let;
  envy_bios_d_dp_info_before_link_speed *bls;
  int link_speed_nums;
  uint16_t data;
  envy_bios_d_dp_info_entry *e;
  int local_20;
  int j;
  int i;
  int err;
  envy_bios_d_dp_info *dp_info;
  envy_bios *bios_local;
  
  peVar12 = &(bios->d).dp_info;
  if (peVar12->offset != 0) {
    bios_u8(bios,(uint)peVar12->offset,&(bios->d).dp_info.version);
    uVar1 = (uint)(bios->d).dp_info.version;
    if (uVar1 - 0x40 < 2) {
      uVar1 = bios_u8(bios,peVar12->offset + 1,&(bios->d).dp_info.hlen);
      uVar2 = bios_u8(bios,peVar12->offset + 2,&(bios->d).dp_info.rlen);
      uVar3 = bios_u8(bios,peVar12->offset + 3,&(bios->d).dp_info.entriesnum);
      uVar4 = bios_u8(bios,peVar12->offset + 4,&(bios->d).dp_info.target_size);
      uVar5 = bios_u8(bios,peVar12->offset + 5,&(bios->d).dp_info.levelentrytables_count);
      uVar6 = bios_u8(bios,peVar12->offset + 6,&(bios->d).dp_info.levelentry_size);
      uVar7 = bios_u8(bios,peVar12->offset + 7,&(bios->d).dp_info.levelentry_count);
      uVar8 = bios_u8(bios,peVar12->offset + 8,&(bios->d).dp_info.flags);
      j = uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
      (bios->d).dp_info.regular_vswing = 0;
      (bios->d).dp_info.low_vswing = 0;
      (bios->d).dp_info.valid = (j != 0U ^ 0xffU) & 1;
    }
    else {
      if (uVar1 != 0x42) {
        fprintf(_stderr,"Unknown d DP INFO table version 0x%x\n",(ulong)(bios->d).dp_info.version);
        return;
      }
      uVar1 = bios_u8(bios,peVar12->offset + 1,&(bios->d).dp_info.hlen);
      uVar2 = bios_u8(bios,peVar12->offset + 2,&(bios->d).dp_info.rlen);
      uVar3 = bios_u8(bios,peVar12->offset + 3,&(bios->d).dp_info.entriesnum);
      uVar4 = bios_u8(bios,peVar12->offset + 4,&(bios->d).dp_info.target_size);
      uVar5 = bios_u8(bios,peVar12->offset + 5,&(bios->d).dp_info.levelentrytables_count);
      uVar6 = bios_u8(bios,peVar12->offset + 6,&(bios->d).dp_info.levelentry_size);
      uVar7 = bios_u8(bios,peVar12->offset + 7,&(bios->d).dp_info.levelentry_count);
      uVar8 = bios_u8(bios,peVar12->offset + 8,&(bios->d).dp_info.flags);
      uVar9 = bios_u16(bios,peVar12->offset + 9,&(bios->d).dp_info.regular_vswing);
      uVar10 = bios_u16(bios,peVar12->offset + 0xb,&(bios->d).dp_info.low_vswing);
      j = uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
      (bios->d).dp_info.valid = (j != 0U ^ 0xffU) & 1;
    }
    peVar13 = (envy_bios_d_dp_info_entry *)malloc((ulong)(bios->d).dp_info.entriesnum * 0x28);
    (bios->d).dp_info.entries = peVar13;
    for (local_20 = 0; local_20 < (int)(uint)(bios->d).dp_info.entriesnum; local_20 = local_20 + 1)
    {
      peVar13 = (bios->d).dp_info.entries + local_20;
      bios_u16(bios,(uint)(ushort)(peVar12->offset + (ushort)(bios->d).dp_info.hlen +
                                  (short)local_20 * (ushort)(bios->d).dp_info.rlen),&peVar13->offset
              );
      if (peVar13->offset != 0) {
        uVar1 = bios_u32(bios,(uint)peVar13->offset,&peVar13->key);
        uVar2 = bios_u8(bios,peVar13->offset + 4,&peVar13->flags);
        uVar3 = bios_u16(bios,peVar13->offset + 5,&peVar13->before_link_training);
        uVar4 = bios_u16(bios,peVar13->offset + 7,&peVar13->after_link_training);
        uVar5 = bios_u16(bios,peVar13->offset + 9,&peVar13->before_link_speed_0);
        uVar6 = bios_u16(bios,peVar13->offset + 0xb,&peVar13->enable_spread);
        uVar7 = bios_u16(bios,peVar13->offset + 0xd,&peVar13->disable_spread);
        uVar8 = bios_u16(bios,peVar13->offset + 0xf,&peVar13->disable_lt);
        uVar9 = bios_u8(bios,peVar13->offset + 0x11,&peVar13->level_entry_table_index);
        uVar10 = bios_u8(bios,peVar13->offset + 0x12,&peVar13->hbr2_min_vdt_index);
        j = uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1 | j;
        peVar13->valid = (j != 0U ^ 0xffU) & 1;
        iVar11 = 3;
        if (0x41 < (bios->d).dp_info.version) {
          iVar11 = 4;
        }
        peVar13->before_link_speed_nums = iVar11;
        peVar14 = (envy_bios_d_dp_info_before_link_speed *)malloc((long)iVar11 * 6);
        peVar13->before_link_speed_entries = peVar14;
        for (e._4_4_ = 0; e._4_4_ < iVar11; e._4_4_ = e._4_4_ + 1) {
          peVar14 = peVar13->before_link_speed_entries + e._4_4_;
          peVar14->offset = peVar13->before_link_speed_0 + (short)e._4_4_ * 3;
          uVar1 = bios_u8(bios,(uint)peVar14->offset,&peVar14->link_rate);
          uVar2 = bios_u16(bios,peVar14->offset + 1,&peVar14->link_rate_ptr);
          j = uVar2 | uVar1 | j;
          peVar14->valid = (j != 0U ^ 0xffU) & 1;
        }
      }
    }
    peVar15 = (envy_bios_d_dp_info_level_entry_table *)
              malloc((ulong)(bios->d).dp_info.levelentrytables_count << 4);
    (bios->d).dp_info.level_entry_tables = peVar15;
    for (local_20 = 0; local_20 < (int)(uint)(bios->d).dp_info.levelentrytables_count;
        local_20 = local_20 + 1) {
      peVar15 = (bios->d).dp_info.level_entry_tables + local_20;
      peVar15->offset =
           peVar12->offset + (ushort)(bios->d).dp_info.hlen +
           (ushort)(bios->d).dp_info.entriesnum * (ushort)(bios->d).dp_info.rlen +
           (short)local_20 * (ushort)(bios->d).dp_info.levelentry_count *
           (ushort)(bios->d).dp_info.levelentry_size;
      peVar16 = (envy_bios_d_dp_info_level_entry *)
                malloc((ulong)(bios->d).dp_info.levelentry_count << 3);
      peVar15->level_entries = peVar16;
      for (e._4_4_ = 0; e._4_4_ < (int)(uint)(bios->d).dp_info.levelentry_count;
          e._4_4_ = e._4_4_ + 1) {
        peVar16 = peVar15->level_entries + e._4_4_;
        peVar16->offset =
             (short)*(undefined4 *)peVar15 +
             (short)(e._4_4_ * (uint)(bios->d).dp_info.levelentry_size);
        uVar1 = (uint)(bios->d).dp_info.version;
        if (uVar1 - 0x40 < 2) {
          uVar1 = bios_u8(bios,(uint)peVar16->offset,&peVar16->post_cursor_2);
          uVar2 = bios_u8(bios,peVar16->offset + 1,&peVar16->drive_current);
          uVar3 = bios_u8(bios,peVar16->offset + 2,&peVar16->pre_emphasis);
          uVar4 = bios_u8(bios,peVar16->offset + 3,&peVar16->tx_pu);
          j = uVar4 | uVar3 | uVar2 | uVar1 | j;
          peVar16->valid = (j != 0U ^ 0xffU) & 1;
        }
        else {
          if (uVar1 != 0x42) {
            fprintf(_stderr,"Unknown d DP INFO LEVEL ENTRY TABLE version 0x%x\n",
                    (ulong)(bios->d).dp_info.version);
            return;
          }
          peVar16->post_cursor_2 = '\0';
          uVar1 = bios_u8(bios,(uint)peVar16->offset,&peVar16->drive_current);
          uVar2 = bios_u8(bios,peVar16->offset + 1,&peVar16->pre_emphasis);
          uVar3 = bios_u8(bios,peVar16->offset + 2,&peVar16->tx_pu);
          j = uVar3 | uVar2 | uVar1 | j;
          peVar16->valid = (j != 0U ^ 0xffU) & 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
envy_bios_parse_d_dp_info(struct envy_bios *bios)
{
	struct envy_bios_d_dp_info *dp_info = &bios->d.dp_info;
	int err = 0, i, j;

	if (!dp_info->offset)
		return;

	bios_u8(bios, dp_info->offset, &dp_info->version);
	switch (dp_info->version) {
	case 0x40:
	case 0x41:
		err |= bios_u8(bios, dp_info->offset + 0x1, &dp_info->hlen);
		err |= bios_u8(bios, dp_info->offset + 0x2, &dp_info->rlen);
		err |= bios_u8(bios, dp_info->offset + 0x3, &dp_info->entriesnum);
		err |= bios_u8(bios, dp_info->offset + 0x4, &dp_info->target_size);
		err |= bios_u8(bios, dp_info->offset + 0x5, &dp_info->levelentrytables_count);
		err |= bios_u8(bios, dp_info->offset + 0x6, &dp_info->levelentry_size);
		err |= bios_u8(bios, dp_info->offset + 0x7, &dp_info->levelentry_count);
		err |= bios_u8(bios, dp_info->offset + 0x8, &dp_info->flags);
		dp_info->regular_vswing = 0;
		dp_info->low_vswing     = 0;
		dp_info->valid = !err;
		break;
	case 0x42:
		err |= bios_u8(bios, dp_info->offset + 0x1, &dp_info->hlen);
		err |= bios_u8(bios, dp_info->offset + 0x2, &dp_info->rlen);
		err |= bios_u8(bios, dp_info->offset + 0x3, &dp_info->entriesnum);
		err |= bios_u8(bios, dp_info->offset + 0x4, &dp_info->target_size);
		err |= bios_u8(bios, dp_info->offset + 0x5, &dp_info->levelentrytables_count);
		err |= bios_u8(bios, dp_info->offset + 0x6, &dp_info->levelentry_size);
		err |= bios_u8(bios, dp_info->offset + 0x7, &dp_info->levelentry_count);
		err |= bios_u8(bios, dp_info->offset + 0x8, &dp_info->flags);
		err |= bios_u16(bios, dp_info->offset + 0x9, &dp_info->regular_vswing);
		err |= bios_u16(bios, dp_info->offset + 0xb, &dp_info->low_vswing);
		dp_info->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown d DP INFO table version 0x%x\n", dp_info->version);
		return;
	}

	dp_info->entries = malloc(dp_info->entriesnum * sizeof(struct envy_bios_d_dp_info_entry));
	for (i = 0; i < dp_info->entriesnum; ++i) {
		struct envy_bios_d_dp_info_entry *e = &dp_info->entries[i];
		uint16_t data = dp_info->offset + dp_info->hlen +
		                i * dp_info->rlen;
		bios_u16(bios, data, &e->offset);

		if (e->offset) {
			err |= bios_u32(bios, e->offset + 0x0, &e->key);
			err |= bios_u8 (bios, e->offset + 0x4, &e->flags);
			err |= bios_u16(bios, e->offset + 0x5, &e->before_link_training);
			err |= bios_u16(bios, e->offset + 0x7, &e->after_link_training);
			err |= bios_u16(bios, e->offset + 0x9, &e->before_link_speed_0);
			err |= bios_u16(bios, e->offset + 0xb, &e->enable_spread);
			err |= bios_u16(bios, e->offset + 0xd, &e->disable_spread);
			err |= bios_u16(bios, e->offset + 0xf, &e->disable_lt);
			err |= bios_u8 (bios, e->offset + 0x11, &e->level_entry_table_index);
			err |= bios_u8 (bios, e->offset + 0x12, &e->hbr2_min_vdt_index);
			e->valid = !err;

			int link_speed_nums = (dp_info->version >= 0x42) ? 4 : 3;
			e->before_link_speed_nums = link_speed_nums;
			e->before_link_speed_entries = malloc(link_speed_nums * sizeof(struct envy_bios_d_dp_info_before_link_speed));
			for (j = 0; j < link_speed_nums; ++j) {
				struct envy_bios_d_dp_info_before_link_speed *bls = &e->before_link_speed_entries[j];
				bls->offset = e->before_link_speed_0 + j * (sizeof(uint8_t) + sizeof(uint16_t));

				err |= bios_u8 (bios, bls->offset + 0x0, &bls->link_rate);
				err |= bios_u16(bios, bls->offset + 0x1, &bls->link_rate_ptr);
				bls->valid = !err;
			}
		}
	}

	dp_info->level_entry_tables = malloc(dp_info->levelentrytables_count * sizeof(struct envy_bios_d_dp_info_level_entry_table));
	for (i = 0; i < dp_info->levelentrytables_count; ++i) {
		struct envy_bios_d_dp_info_level_entry_table *let = &dp_info->level_entry_tables[i];
		let->offset = dp_info->offset + dp_info->hlen +
		              dp_info->entriesnum * dp_info->rlen +
		              i * dp_info->levelentry_count * dp_info->levelentry_size;

		let->level_entries = malloc(dp_info->levelentry_count * sizeof(struct envy_bios_d_dp_info_level_entry));
		for (j = 0; j < dp_info->levelentry_count; ++j) {
			struct envy_bios_d_dp_info_level_entry *le = &let->level_entries[j];
			le->offset = let->offset + j * dp_info->levelentry_size;

			switch (dp_info->version) {
				case 0x40:
				case 0x41:
					err |= bios_u8(bios, le->offset + 0x0, &le->post_cursor_2);
					err |= bios_u8(bios, le->offset + 0x1, &le->drive_current);
					err |= bios_u8(bios, le->offset + 0x2, &le->pre_emphasis);
					err |= bios_u8(bios, le->offset + 0x3, &le->tx_pu);
					le->valid = !err;
					break;
				case 0x42:
					le->post_cursor_2 = 0;
					err |= bios_u8(bios, le->offset + 0x0, &le->drive_current);
					err |= bios_u8(bios, le->offset + 0x1, &le->pre_emphasis);
					err |= bios_u8(bios, le->offset + 0x2, &le->tx_pu);
					le->valid = !err;
					break;
				default:
					ENVY_BIOS_ERR("Unknown d DP INFO LEVEL ENTRY TABLE version 0x%x\n", dp_info->version);
					return;
				}
		}
	}
}